

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O3

CURLcode cw_out_append(cw_out_ctx *ctx,Curl_easy *data,cw_out_type otype,char *buf,size_t blen)

{
  curl_trc_feat *pcVar1;
  CURLcode CVar2;
  size_t sVar3;
  cw_out_buf *pcVar4;
  long lVar5;
  
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
      ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) &&
     (0 < Curl_trc_feat_write.log_level)) {
    lVar5 = 0;
    for (pcVar4 = ctx->buf; pcVar4 != (cw_out_buf *)0x0; pcVar4 = pcVar4->next) {
      sVar3 = Curl_dyn_len(&pcVar4->b);
      lVar5 = lVar5 + sVar3;
    }
    Curl_trc_write(data,"[OUT] paused, buffering %zu more bytes (%zu/%d)",blen,lVar5,0x4000000);
  }
  lVar5 = 0;
  for (pcVar4 = ctx->buf; pcVar4 != (cw_out_buf *)0x0; pcVar4 = pcVar4->next) {
    sVar3 = Curl_dyn_len(&pcVar4->b);
    lVar5 = lVar5 + sVar3;
  }
  if (lVar5 + blen < 0x4000001) {
    pcVar4 = ctx->buf;
    if (((pcVar4 == (cw_out_buf *)0x0) || (otype == CW_OUT_HDS)) || (pcVar4->type != otype)) {
      pcVar4 = (cw_out_buf *)(*Curl_ccalloc)(1,0x30);
      if (pcVar4 == (cw_out_buf *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar4->type = otype;
      Curl_dyn_init(&pcVar4->b,0x4000000);
      pcVar4->next = ctx->buf;
      ctx->buf = pcVar4;
    }
    CVar2 = Curl_dyn_addn(&pcVar4->b,buf,blen);
    return CVar2;
  }
  Curl_failf(data,"pause buffer not large enough -> CURLE_TOO_LARGE");
  return CURLE_TOO_LARGE;
}

Assistant:

static CURLcode cw_out_append(struct cw_out_ctx *ctx,
                              struct Curl_easy *data,
                              cw_out_type otype,
                              const char *buf, size_t blen)
{
  CURL_TRC_WRITE(data, "[OUT] paused, buffering %zu more bytes (%zu/%d)",
                 blen, cw_out_bufs_len(ctx), DYN_PAUSE_BUFFER);
  if(cw_out_bufs_len(ctx) + blen > DYN_PAUSE_BUFFER) {
    failf(data, "pause buffer not large enough -> CURLE_TOO_LARGE");
    return CURLE_TOO_LARGE;
  }

  /* if we do not have a buffer, or it is of another type, make a new one.
   * And for CW_OUT_HDS always make a new one, so we "replay" headers
   * exactly as they came in */
  if(!ctx->buf || (ctx->buf->type != otype) || (otype == CW_OUT_HDS)) {
    struct cw_out_buf *cwbuf = cw_out_buf_create(otype);
    if(!cwbuf)
      return CURLE_OUT_OF_MEMORY;
    cwbuf->next = ctx->buf;
    ctx->buf = cwbuf;
  }
  DEBUGASSERT(ctx->buf && (ctx->buf->type == otype));
  return Curl_dyn_addn(&ctx->buf->b, buf, blen);
}